

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O3

Maybe<kj::Promise<unsigned_long>_> __thiscall
kj::anon_unknown_0::AsyncStreamFd::tryPumpFrom
          (AsyncStreamFd *this,AsyncInputStream *input,uint64_t amount)

{
  PromiseArenaMember *pPVar1;
  uchar *puVar2;
  size_t sVar3;
  Fault FVar4;
  char *node;
  OwnPromiseNode node_00;
  int iVar5;
  uint uVar6;
  _func_int **readSoFar;
  ssize_t sVar7;
  PromiseArena *pPVar8;
  Exception *__dest;
  void *pvVar9;
  PromiseArena *in_RCX;
  undefined8 uVar10;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2 extraout_RDX_01;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2 extraout_RDX_02;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2 extraout_RDX_03;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2 extraout_RDX_04;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2 extraout_RDX_05;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2 extraout_RDX_06;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2 aVar11;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2 extraout_RDX_07;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2 extraout_RDX_08;
  FileInputStream *file;
  PromiseArena *__n;
  TransformPromiseNodeBase *this_00;
  size_t sVar12;
  undefined1 auVar13 [16];
  Maybe<kj::Promise<unsigned_long>_> MVar14;
  Promise<void> promise;
  Fault f;
  byte buffer [4096];
  Array<unsigned_char> local_10a0;
  Fault local_1088;
  size_t sStack_1080;
  undefined8 *local_1078;
  SourceLocation local_1068;
  undefined8 local_1050;
  OwnPromiseNode local_1048;
  TransformPromiseNodeBase *local_1040;
  AsyncStreamFd local_1038 [24];
  
  uVar10 = 0;
  readSoFar = (_func_int **)
              __dynamic_cast(amount,&AsyncInputStream::typeinfo,
                             &(anonymous_namespace)::AsyncStreamFd::typeinfo);
  if (readSoFar == (_func_int **)0x0) {
    auVar13 = __dynamic_cast(amount,&AsyncInputStream::typeinfo,&FileInputStream::typeinfo,0);
    aVar11 = auVar13._8_8_;
    if (auVar13._0_8_ != 0) {
      (**(code **)**(undefined8 **)(auVar13._0_8_ + 8))(local_1038);
      aVar11 = extraout_RDX;
      if ((char)local_1038[0].super_AsyncCapabilityStream.super_AsyncIoStream.super_AsyncInputStream
                ._vptr_AsyncInputStream == '\x01') {
        pumpFromFile(local_1038,(FileInputStream *)input,auVar13._0_4_,
                     (ulong)local_1038[0].super_AsyncCapabilityStream.super_AsyncIoStream.
                            super_AsyncInputStream._vptr_AsyncInputStream._4_4_,(uint64_t)in_RCX);
        *(undefined1 *)
         &(this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
          _vptr_AsyncInputStream = 1;
        (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncOutputStream.
        _vptr_AsyncOutputStream =
             (_func_int **)
             CONCAT44(local_1038[0].super_AsyncCapabilityStream.super_AsyncIoStream.
                      super_AsyncInputStream._vptr_AsyncInputStream._4_4_,
                      local_1038[0].super_AsyncCapabilityStream.super_AsyncIoStream.
                      super_AsyncInputStream._vptr_AsyncInputStream._0_4_);
        aVar11 = extraout_RDX_00;
        goto LAB_0048f661;
      }
    }
    *(undefined1 *)
     &(this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
      _vptr_AsyncInputStream = 0;
  }
  else {
    __n = (PromiseArena *)0x0;
    local_10a0.disposer = (ArrayDisposer *)this;
    memset(local_1038,0,0x1000);
    pPVar8 = (PromiseArena *)0x1000;
    if (in_RCX < (PromiseArena *)0x1000) {
      pPVar8 = in_RCX;
    }
    local_10a0.size_ = (size_t)in_RCX;
    if (in_RCX == (PromiseArena *)0x0) {
LAB_0048f29d:
      uVar10 = 0;
    }
    else {
      __n = (PromiseArena *)0x0;
      do {
        while( true ) {
          sVar7 = read(*(int *)(readSoFar + 2),
                       (void *)((long)&local_1038[0].super_AsyncCapabilityStream.super_AsyncIoStream
                                       .super_AsyncInputStream._vptr_AsyncInputStream + (long)__n),
                       (long)pPVar8 - (long)__n);
          if (-1 < sVar7) break;
          iVar5 = kj::_::Debug::getOsErrorNumber(true);
          if (iVar5 != -1) {
            if (iVar5 != 0) {
              local_1088.exception = (Exception *)0x0;
              local_1068.fileName = (char *)0x0;
              local_1068.function = (char *)0x0;
              kj::_::Debug::Fault::init
                        (&local_1088,
                         (EVP_PKEY_CTX *)
                         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
                        );
              kj::_::Debug::Fault::fatal(&local_1088);
            }
            goto LAB_0048f29d;
          }
        }
        uVar10 = CONCAT71((int7)((ulong)uVar10 >> 8),sVar7 == 0);
      } while ((sVar7 != 0) && (__n = (PromiseArena *)(__n->bytes + sVar7), __n < pPVar8));
    }
    local_1050 = uVar10;
    do {
      pPVar8 = (PromiseArena *)
               ::write(*(int *)&input[2]._vptr_AsyncInputStream,local_1038,(size_t)__n);
      if (-1 < (long)pPVar8) goto LAB_0048f31d;
      uVar6 = kj::_::Debug::getOsErrorNumber(true);
    } while (uVar6 == 0xffffffff);
    pPVar8 = (PromiseArena *)(ulong)uVar6;
    if (uVar6 != 0) {
      local_1088.exception = (Exception *)0x0;
      local_1068.fileName = (char *)0x0;
      local_1068.function = (char *)0x0;
      kj::_::Debug::Fault::init
                (&local_1088,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
                );
      kj::_::Debug::Fault::fatal(&local_1088);
    }
LAB_0048f31d:
    this = (AsyncStreamFd *)local_10a0.disposer;
    sVar12 = (long)__n - (long)pPVar8;
    if (__n < pPVar8 || sVar12 == 0) {
      if ((__n != (PromiseArena *)local_10a0.size_ & ((byte)local_1050 ^ 1)) == 0) {
        local_1068.fileName = (char *)__n;
        kj::_::PromiseDisposer::
        alloc<kj::_::ImmediatePromiseNode<unsigned_long>,kj::_::PromiseDisposer,unsigned_long>
                  ((PromiseDisposer *)
                   &(((AsyncCapabilityStream *)&(local_10a0.disposer)->_vptr_ArrayDisposer)->
                    super_AsyncIoStream).super_AsyncOutputStream,(unsigned_long *)&local_1068);
        aVar11 = extraout_RDX_02;
      }
      else {
        splicePumpFrom((AsyncStreamFd *)
                       &(((AsyncCapabilityStream *)&(local_10a0.disposer)->_vptr_ArrayDisposer)->
                        super_AsyncIoStream).super_AsyncOutputStream,(AsyncStreamFd *)input,
                       (uint64_t)readSoFar,(uint64_t)__n);
        aVar11 = extraout_RDX_03;
      }
      *(undefined1 *)
       &(((AsyncCapabilityStream *)&((ArrayDisposer *)this)->_vptr_ArrayDisposer)->
        super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream = 1;
    }
    else {
      __dest = (Exception *)
               kj::_::HeapArrayDisposer::allocateImpl
                         (1,0,sVar12,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
      memcpy(__dest,(void *)((long)&local_1038[0].super_AsyncCapabilityStream.super_AsyncIoStream.
                                    super_AsyncInputStream._vptr_AsyncInputStream + (long)pPVar8),
             sVar12);
      local_1078 = &kj::_::HeapArrayDisposer::instance;
      local_1088.exception = __dest;
      sStack_1080 = sVar12;
      (*input->_vptr_AsyncInputStream[0x14])(&local_10a0,input,__dest,sVar12);
      this = (AsyncStreamFd *)local_10a0.disposer;
      Promise<void>::attach<kj::Array<unsigned_char>>((Promise<void> *)&local_1068,&local_10a0);
      sVar3 = local_10a0.size_;
      puVar2 = local_10a0.ptr;
      local_10a0.ptr = (uchar *)local_1068.fileName;
      local_1068.fileName = (char *)0x0;
      if (((PromiseArenaMember *)puVar2 != (PromiseArenaMember *)0x0) &&
         (kj::_::PromiseDisposer::dispose((PromiseArenaMember *)puVar2), node = local_1068.fileName,
         (PromiseArenaMember *)local_1068.fileName != (PromiseArenaMember *)0x0)) {
        local_1068.fileName = (char *)0x0;
        kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node);
      }
      puVar2 = local_10a0.ptr;
      if ((__n != (PromiseArena *)sVar3 & ((byte)local_1050 ^ 1)) == 0) {
        pPVar8 = *(PromiseArena **)((long)local_10a0.ptr + 8);
        if (pPVar8 == (PromiseArena *)0x0 || (ulong)((long)local_10a0.ptr - (long)pPVar8) < 0x28) {
          pvVar9 = operator_new(0x400);
          kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                    ((TransformPromiseNodeBase *)((long)pvVar9 + 0x3d8),
                     (OwnPromiseNode *)&local_10a0,
                     kj::_::
                     SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++:352:31)>
                     ::anon_class_8_1_ba1d6db4_for_func::operator());
          *(undefined ***)((long)pvVar9 + 0x3d8) = &PTR_destroy_006e2148;
          *(PromiseArena **)((long)pvVar9 + 0x3f8) = __n;
          *(void **)((long)pvVar9 + 0x3e0) = pvVar9;
          aVar11 = extraout_RDX_01;
          local_1040 = (TransformPromiseNodeBase *)((long)pvVar9 + 0x3d8);
        }
        else {
          *(PromiseArena **)((long)local_10a0.ptr + 8) = (PromiseArena *)0x0;
          pPVar1 = (PromiseArenaMember *)((long)local_10a0.ptr + -0x30);
          kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                    ((TransformPromiseNodeBase *)&pPVar1->arena,(OwnPromiseNode *)&local_10a0,
                     kj::_::
                     SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++:352:31)>
                     ::anon_class_8_1_ba1d6db4_for_func::operator());
          ((PromiseArenaMember *)((long)puVar2 + -0x30))->arena =
               (PromiseArena *)&PTR_destroy_006e2148;
          ((PromiseArenaMember *)((long)puVar2 + -0x10))->arena = __n;
          ((PromiseArenaMember *)((long)puVar2 + -0x20))->_vptr_PromiseArenaMember =
               (_func_int **)pPVar8;
          aVar11 = extraout_RDX_04;
          local_1040 = (TransformPromiseNodeBase *)&pPVar1->arena;
        }
      }
      else {
        pPVar8 = *(PromiseArena **)((long)local_10a0.ptr + 8);
        if (pPVar8 == (PromiseArena *)0x0 || (ulong)((long)local_10a0.ptr - (long)pPVar8) < 0x40) {
          pvVar9 = operator_new(0x400);
          this_00 = (TransformPromiseNodeBase *)((long)pvVar9 + 0x3c0);
          kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                    (this_00,(OwnPromiseNode *)&local_10a0,
                     kj::_::
                     SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++:354:31)>
                     ::anon_class_32_4_8eb467c7_for_func::operator());
          *(undefined ***)((long)pvVar9 + 0x3c0) = &PTR_destroy_006e21a0;
          *(_func_int ***)((long)pvVar9 + 0x3e0) = readSoFar;
          *(AsyncInputStream **)((long)pvVar9 + 1000) = input;
          *(PromiseArena **)((long)pvVar9 + 0x3f0) = __n;
          *(size_t *)((long)pvVar9 + 0x3f8) = local_10a0.size_;
          *(void **)((long)pvVar9 + 0x3c8) = pvVar9;
        }
        else {
          *(PromiseArena **)((long)local_10a0.ptr + 8) = (PromiseArena *)0x0;
          this_00 = (TransformPromiseNodeBase *)((long)local_10a0.ptr + -0x40);
          kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                    (this_00,(OwnPromiseNode *)&local_10a0,
                     kj::_::
                     SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++:354:31)>
                     ::anon_class_32_4_8eb467c7_for_func::operator());
          ((PromiseArenaMember *)((long)puVar2 + -0x40))->_vptr_PromiseArenaMember =
               (_func_int **)&PTR_destroy_006e21a0;
          ((PromiseArenaMember *)((long)puVar2 + -0x20))->_vptr_PromiseArenaMember = readSoFar;
          ((PromiseArenaMember *)((long)puVar2 + -0x20))->arena = (PromiseArena *)input;
          ((PromiseArenaMember *)((long)puVar2 + -0x10))->_vptr_PromiseArenaMember =
               (_func_int **)__n;
          ((PromiseArenaMember *)((long)puVar2 + -0x10))->arena = (PromiseArena *)local_10a0.size_;
          ((PromiseArenaMember *)((long)puVar2 + -0x40))->arena = pPVar8;
        }
        local_1068.fileName =
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-inl.h"
        ;
        local_1068.function = "then";
        local_1068.lineNumber = 0x58b;
        local_1068.columnNumber = 0x4c;
        local_1048.ptr = &this_00->super_PromiseNode;
        kj::_::PromiseDisposer::
        appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
                  ((PromiseDisposer *)&local_1040,&local_1048,&local_1068);
        node_00.ptr = local_1048.ptr;
        aVar11 = extraout_RDX_05;
        this = (AsyncStreamFd *)local_10a0.disposer;
        if ((TransformPromiseNodeBase *)local_1048.ptr != (TransformPromiseNodeBase *)0x0) {
          local_1048.ptr = (PromiseNode *)0x0;
          kj::_::PromiseDisposer::dispose(&(node_00.ptr)->super_PromiseArenaMember);
          aVar11 = extraout_RDX_06;
          this = (AsyncStreamFd *)local_10a0.disposer;
        }
      }
      puVar2 = local_10a0.ptr;
      *(undefined1 *)
       &(this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
        _vptr_AsyncInputStream = 1;
      (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncOutputStream.
      _vptr_AsyncOutputStream = (_func_int **)local_1040;
      if ((PromiseArenaMember *)local_10a0.ptr != (PromiseArenaMember *)0x0) {
        local_10a0.ptr = (uchar *)0x0;
        kj::_::PromiseDisposer::dispose((PromiseArenaMember *)puVar2);
        aVar11 = extraout_RDX_07;
      }
      sVar12 = sStack_1080;
      FVar4.exception = local_1088.exception;
      if (local_1088.exception != (Exception *)0x0) {
        local_1088.exception = (Exception *)0x0;
        sStack_1080 = 0;
        (**(code **)*local_1078)(local_1078,FVar4.exception,1,sVar12,sVar12,0);
        aVar11 = extraout_RDX_08;
      }
    }
  }
LAB_0048f661:
  MVar14.ptr.field_1 = aVar11;
  MVar14.ptr._0_8_ = this;
  return (Maybe<kj::Promise<unsigned_long>_>)MVar14.ptr;
}

Assistant:

Maybe<Promise<uint64_t>> tryPumpFrom(
      AsyncInputStream& input, uint64_t amount = kj::maxValue) override {
#if __linux__ && !__ANDROID__
    KJ_IF_SOME(sock, kj::dynamicDowncastIfAvailable<AsyncStreamFd>(input)) {
      return pumpFromOther(sock, amount);
    }
#endif

#if __linux__
    KJ_IF_SOME(file, kj::dynamicDowncastIfAvailable<FileInputStream>(input)) {
      KJ_IF_SOME(fd, file.getUnderlyingFile().getFd()) {
        return pumpFromFile(file, fd, amount, 0);
      }
    }
#endif

    return kj::none;
  }